

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,TextureCubeView *src,float *texCoord,ReferenceParams *params)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  byte bVar11;
  bool bVar12;
  ulong uVar13;
  int i;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int faceSize;
  int iVar19;
  int iVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  Vec3 coord;
  Vector<float,_4> res_1;
  Vec3 triW [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec3 coordDy;
  Vec3 coordDx;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vector<float,_4> res;
  TextureCubeView src_1;
  TextureCubeView view;
  float local_1c4;
  Vec3 local_1bc;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  uint uStack_184;
  undefined8 uStack_180;
  float local_178 [8];
  float local_158 [8];
  float local_138 [8];
  float local_118 [6];
  Vec3 local_100;
  Vec3 local_f4;
  undefined1 local_e8 [24];
  ConstPixelBufferAccess *pCStack_d0;
  ConstPixelBufferAccess *local_c8;
  ConstPixelBufferAccess *local_b8;
  undefined8 uStack_b0;
  undefined1 local_a0 [56];
  TextureCubeView local_68;
  
  getSubView(&local_68,src,params->baseLevel,params->maxLevel);
  fVar23 = *texCoord;
  fVar24 = texCoord[1];
  fVar27 = texCoord[3];
  fVar28 = texCoord[6];
  fVar1 = texCoord[9];
  fVar2 = texCoord[4];
  fVar3 = texCoord[7];
  fVar4 = texCoord[10];
  fVar5 = texCoord[2];
  fVar6 = texCoord[5];
  fVar7 = texCoord[8];
  fVar8 = texCoord[0xb];
  local_e8._16_8_ = (ConstPixelBufferAccess *)0x0;
  pCStack_d0 = (ConstPixelBufferAccess *)0x0;
  local_c8 = (ConstPixelBufferAccess *)0x0;
  tcu::getEffectiveTextureView
            ((TextureCubeView *)local_a0,&local_68,
             (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             (local_e8 + 0x10),&params->sampler);
  if ((int)local_a0._0_4_ < 1) {
    faceSize = 0;
  }
  else {
    faceSize = ((IVec3 *)(local_a0._8_8_ + 8))->m_data[0];
  }
  fVar22 = (float)dst->m_width;
  local_118[0] = fVar23;
  local_118[1] = fVar27;
  local_118[2] = fVar28;
  local_118[3] = fVar1;
  local_118[4] = fVar28;
  local_118[5] = fVar27;
  local_138[0] = fVar24;
  local_138[1] = fVar2;
  local_138[2] = fVar3;
  local_138[3] = fVar4;
  local_138[4] = fVar3;
  local_138[5] = fVar2;
  local_158[0] = fVar5;
  local_158[1] = fVar6;
  local_158[2] = fVar7;
  local_158[3] = fVar8;
  local_158[4] = fVar7;
  local_158[5] = fVar6;
  local_178[1] = (params->super_RenderParams).w.m_data[1];
  local_178[2] = (params->super_RenderParams).w.m_data[2];
  local_178[0] = (params->super_RenderParams).w.m_data[0];
  local_178[3] = (params->super_RenderParams).w.m_data[3];
  local_178[4] = local_178[2];
  local_178[5] = local_178[1];
  local_1c4 = 0.0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    local_1c4 = (params->super_RenderParams).bias;
  }
  if (0 < dst->m_height) {
    fVar23 = (float)dst->m_height;
    iVar19 = 0;
    do {
      if (0 < dst->m_width) {
        fVar24 = (float)iVar19 + 0.5;
        local_1ac = fVar24 / fVar23;
        local_1b0 = 1.0 - local_1ac;
        iVar20 = 0;
        do {
          fVar28 = (float)iVar20 + 0.5;
          fVar27 = fVar28 / fVar22;
          bVar12 = 1.0 <= local_1ac + fVar27;
          local_18c = local_1ac;
          if (bVar12) {
            fVar27 = 1.0 - fVar27;
            local_18c = local_1b0;
          }
          uVar13 = (ulong)bVar12;
          fVar1 = local_118[uVar13 * 3];
          fVar2 = local_118[uVar13 * 3 + 1];
          fVar3 = local_118[uVar13 * 3 + 2];
          local_1bc.m_data[0] = (fVar2 - fVar1) * local_18c + (fVar3 - fVar1) * fVar27 + fVar1;
          fVar4 = local_138[uVar13 * 3];
          fVar5 = local_138[uVar13 * 3 + 1];
          fVar6 = local_138[uVar13 * 3 + 2];
          local_1bc.m_data[1] = (fVar5 - fVar4) * local_18c + (fVar6 - fVar4) * fVar27 + fVar4;
          fVar7 = local_158[uVar13 * 3];
          fVar8 = local_158[uVar13 * 3 + 2];
          local_1a8 = local_158[uVar13 * 3 + 1];
          local_1bc.m_data[2] = (local_1a8 - fVar7) * local_18c + (fVar8 - fVar7) * fVar27 + fVar7;
          fVar26 = local_18c + -1.0;
          fVar9 = local_178[uVar13 * 3 + 1];
          local_190 = fVar28 * fVar9;
          fVar10 = local_178[uVar13 * 3 + 2];
          local_1a4 = fVar9 * fVar10;
          local_194 = local_178[uVar13 * 3];
          fVar25 = fVar9 * local_194 * fVar10;
          local_198 = (fVar2 - fVar1) * fVar10;
          local_19c = fVar24 * fVar10;
          local_1a0 = (fVar1 - fVar2) * fVar10;
          local_f4.m_data[2] =
               (fVar22 * fVar26 + fVar28) * local_1a4 -
               (fVar10 * fVar22 * local_18c + local_190) * local_194;
          fVar28 = fVar25 * fVar22;
          local_f4.m_data[2] = local_f4.m_data[2] * local_f4.m_data[2];
          local_f4.m_data[0] =
               (((fVar1 - fVar3) * fVar9 * fVar26 +
                (local_198 + (fVar3 - fVar2) * local_194) * local_18c) * fVar28) /
               local_f4.m_data[2];
          local_f4.m_data[1] =
               (((fVar4 - fVar6) * fVar9 * fVar26 +
                ((fVar5 - fVar4) * fVar10 + (fVar6 - fVar5) * local_194) * local_18c) * fVar28) /
               local_f4.m_data[2];
          local_f4.m_data[2] =
               (((fVar7 - fVar8) * fVar9 * fVar26 +
                ((local_1a8 - fVar7) * fVar10 + (fVar8 - local_1a8) * local_194) * local_18c) *
               fVar28) / local_f4.m_data[2];
          fVar28 = fVar27 + -1.0;
          local_100.m_data[2] =
               (fVar23 * fVar28 + fVar24) * local_1a4 -
               (fVar9 * fVar23 * fVar27 + local_19c) * local_194;
          fVar25 = fVar25 * fVar23;
          local_100.m_data[2] = local_100.m_data[2] * local_100.m_data[2];
          local_100.m_data[0] =
               ((local_1a0 * fVar28 +
                ((fVar2 - fVar3) * local_194 + (fVar3 - fVar1) * fVar9) * fVar27) * fVar25) /
               local_100.m_data[2];
          local_100.m_data[1] =
               (((fVar4 - fVar5) * fVar10 * fVar28 +
                ((fVar5 - fVar6) * local_194 + (fVar6 - fVar4) * fVar9) * fVar27) * fVar25) /
               local_100.m_data[2];
          local_100.m_data[2] =
               (((fVar7 - local_1a8) * fVar10 * fVar28 +
                ((local_1a8 - fVar8) * local_194 + (fVar8 - fVar7) * fVar9) * fVar27) * fVar25) /
               local_100.m_data[2];
          fVar28 = computeCubeLodFromDerivates
                             (params->lodMode,&local_1bc,&local_f4,&local_100,faceSize);
          fVar28 = fVar28 + local_1c4;
          fVar27 = params->maxLod;
          if (fVar28 <= params->maxLod) {
            fVar27 = fVar28;
          }
          uVar21 = -(uint)(fVar28 < params->minLod);
          fVar27 = (float)(uVar21 & (uint)params->minLod | ~uVar21 & (uint)fVar27);
          if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
            local_e8._0_4_ =
                 tcu::TextureCubeView::sampleCompare
                           ((TextureCubeView *)local_a0,&params->sampler,
                            (params->super_RenderParams).ref,local_1bc.m_data[0],local_1bc.m_data[1]
                            ,local_1bc.m_data[2],fVar27);
            local_e8._4_8_ = 0;
            local_e8._12_4_ = 0x3f800000;
          }
          else {
            tcu::TextureCubeView::sample
                      ((TextureCubeView *)local_e8,(Sampler *)local_a0,local_1bc.m_data[0],
                       local_1bc.m_data[1],local_1bc.m_data[2],fVar27);
          }
          local_b8 = (ConstPixelBufferAccess *)0x0;
          uStack_b0 = 0;
          lVar15 = 0;
          do {
            *(float *)((long)&local_b8 + lVar15 * 4) =
                 *(float *)(local_e8 + lVar15 * 4) *
                 (params->super_RenderParams).colorScale.m_data[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          _local_188 = 0;
          uStack_180 = 0;
          lVar15 = 0;
          do {
            (&local_188)[lVar15] =
                 *(float *)((long)&local_b8 + lVar15 * 4) +
                 (params->super_RenderParams).colorBias.m_data[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          bVar11 = dst->m_colorMask;
          uVar14 = 0;
          uVar21 = 0;
          if ((bVar11 & 1) != 0) {
            uVar16 = 0x7e - ((int)local_188 >> 0x17);
            uVar21 = (((uint)local_188 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar16 & 0x1f)) +
                     0x800000;
            if (8 < uVar16) {
              uVar21 = uVar16;
            }
            uVar21 = uVar21 >> 0x18;
          }
          if ((bVar11 & 2) != 0) {
            uVar16 = 0x7e - ((int)uStack_184 >> 0x17);
            uVar14 = ((uStack_184 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar16 & 0x1f)) +
                     0x800000;
            if (8 < uVar16) {
              uVar14 = uVar16;
            }
            uVar14 = uVar14 >> 0x10 & 0xff00;
          }
          uVar16 = 0;
          if ((bVar11 & 4) != 0) {
            uVar17 = 0x7e - ((int)(uint)uStack_180 >> 0x17);
            uVar16 = (((uint)uStack_180 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar17 & 0x1f)) +
                     0x800000;
            if (8 < uVar17) {
              uVar16 = uVar17;
            }
            uVar16 = uVar16 >> 8 & 0xff0000;
          }
          uVar17 = 0xff000000;
          if ((bVar11 & 8) != 0) {
            uVar18 = 0x7e - ((int)uStack_180._4_4_ >> 0x17);
            uVar17 = ((uStack_180._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar18 & 0x1f)) +
                     0x800000;
            if (8 < uVar18) {
              uVar17 = uVar18;
            }
            uVar17 = uVar17 & 0xff000000;
          }
          *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                   (long)((dst->m_y + iVar19) * dst->m_surface->m_width + dst->m_x + iVar20) * 4) =
               uVar14 | uVar21 | uVar16 | uVar17;
          iVar20 = iVar20 + 1;
        } while (iVar20 < dst->m_width);
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < dst->m_height);
  }
  if ((ConstPixelBufferAccess *)local_e8._16_8_ != (ConstPixelBufferAccess *)0x0) {
    operator_delete((void *)local_e8._16_8_,(long)local_c8 - local_e8._16_8_);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::TextureCubeView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::TextureCubeView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4				rq		= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	return sampleTextureCube(dst, view, sq, tq, rq, params);
}